

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

Ssw_Cla_t * Ssw_ClassesPrepareTargets(Aig_Man_t *pAig)

{
  int iVar1;
  Ssw_Cla_t *pSVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Ssw_Cla_t *p;
  Aig_Man_t *pAig_local;
  
  pSVar2 = Ssw_ClassesStart(pAig);
  pSVar2->nCands1 = 0;
  for (local_24 = 0; iVar1 = Saig_ManPoNum(pAig), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_24);
    pAVar3 = Aig_ObjFanin0(pAVar3);
    Ssw_ObjSetConst1Cand(pAig,pAVar3);
    pSVar2->nCands1 = pSVar2->nCands1 + 1;
  }
  ppAVar4 = (Aig_Obj_t **)malloc((long)pSVar2->nCands1 << 3);
  pSVar2->pMemClasses = ppAVar4;
  pSVar2->pMemClassesFree = ppAVar4;
  return pSVar2;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepareTargets( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    Aig_Obj_t * pObj;
    int i;
    // start the classes
    p = Ssw_ClassesStart( pAig );
    // go through the nodes
    p->nCands1 = 0;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        Ssw_ObjSetConst1Cand( pAig, Aig_ObjFanin0(pObj) );
        p->nCands1++;
    }
    // allocate room for classes
    p->pMemClassesFree = p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, p->nCands1 );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}